

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowAggStep(WindowCodeArg *p,Window *pMWin,int csr,int bInverse,int reg)

{
  Parse *pParse_00;
  int iVar1;
  Parse *p_00;
  int in_ECX;
  int in_EDX;
  Window *in_RSI;
  undefined8 *in_RDI;
  CollSeq *pColl;
  VdbeOp *pOp;
  int iEnd;
  int iOp;
  int addrIsNull;
  int regTmp;
  int addrIf;
  int i;
  int nArg;
  int regArg;
  FuncDef *pFunc;
  Window *pWin;
  Vdbe *v;
  Parse *pParse;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Parse *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int p2;
  Vdbe *in_stack_ffffffffffffff90;
  Vdbe *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int local_5c;
  int in_stack_ffffffffffffffac;
  int srcReg;
  int target;
  u16 p5;
  int iVar2;
  Parse *pParse_01;
  Window *local_38;
  
  pParse_00 = (Parse *)*in_RDI;
  p_00 = (Parse *)sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78));
  for (local_38 = in_RSI; local_38 != (Window *)0x0; local_38 = local_38->pNextWin) {
    pParse_01 = (Parse *)local_38->pWFunc;
    if (local_38->bExprArgs == '\0') {
      p2 = windowArgCount(local_38);
    }
    else {
      p2 = 0;
    }
    srcReg = 0;
    iVar2 = p2;
    for (target = 0; target < iVar2; target = target + 1) {
      iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      if ((target == 1) && (*(char **)&pParse_01->nTab == "nth_value")) {
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff98,iVar1,(int)in_stack_ffffffffffffff90,p2,
                          in_stack_ffffffffffffff88);
      }
      else {
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff98,iVar1,(int)in_stack_ffffffffffffff90,p2,
                          in_stack_ffffffffffffff88);
      }
    }
    if (local_38->pFilter != (Expr *)0x0) {
      in_stack_ffffffffffffffac = sqlite3GetTempReg(pParse_00);
      sqlite3VdbeAddOp3(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (int)in_stack_ffffffffffffff90,p2,in_stack_ffffffffffffff88);
      srcReg = sqlite3VdbeAddOp3(in_stack_ffffffffffffff98,
                                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                 (int)in_stack_ffffffffffffff90,p2,in_stack_ffffffffffffff88);
      sqlite3ReleaseTempReg(pParse_00,in_stack_ffffffffffffffac);
    }
    p5 = (u16)iVar2;
    if (((in_RSI->regStartRowid == 0) && (((ulong)pParse_01->db & 0x100000000000) != 0)) &&
       (local_38->eStart != '[')) {
      sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78);
      if (in_ECX == 0) {
        sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,0);
        sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,0);
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          (int)in_stack_ffffffffffffff90,p2,in_stack_ffffffffffffff88);
        sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78,0);
      }
      else {
        sqlite3VdbeAddOp4Int
                  (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90,p2,in_stack_ffffffffffffff88,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                          in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff80 = p_00;
        sqlite3VdbeCurrentAddr((Vdbe *)p_00);
        sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else if (local_38->regApp == 0) {
      if (*(code **)&pParse_01->rc != noopStepFunc) {
        if (local_38->bExprArgs != '\0') {
          local_5c = sqlite3VdbeCurrentAddr((Vdbe *)p_00);
          iVar2 = ((local_38->pOwner->x).pList)->nExpr;
          iVar1 = sqlite3GetTempRange((Parse *)CONCAT44(p2,in_stack_ffffffffffffff88),
                                      (int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
          sqlite3ExprCodeExprList
                    (pParse_01,(ExprList *)CONCAT44(iVar1,iVar2),target,srcReg,
                     (u8)((uint)in_stack_ffffffffffffffac >> 0x18));
          in_stack_ffffffffffffffa0 = sqlite3VdbeCurrentAddr((Vdbe *)p_00);
          for (; p5 = (u16)iVar2, local_5c < in_stack_ffffffffffffffa0; local_5c = local_5c + 1) {
            in_stack_ffffffffffffff98 = (Vdbe *)sqlite3VdbeGetOp((Vdbe *)p_00,local_5c);
            if ((*(u8 *)&in_stack_ffffffffffffff98->db == '^') &&
               (*(int *)((long)&in_stack_ffffffffffffff98->db + 4) == in_RSI->iEphCsr)) {
              *(int *)((long)&in_stack_ffffffffffffff98->db + 4) = in_EDX;
            }
          }
        }
        if (((ulong)pParse_01->db & 0x2000000000) != 0) {
          in_stack_ffffffffffffff90 =
               (Vdbe *)sqlite3ExprNNCollSeq
                                 (in_stack_ffffffffffffff80,
                                  (Expr *)CONCAT44(in_stack_ffffffffffffff7c,
                                                   in_stack_ffffffffffffff78));
          in_stack_ffffffffffffff78 = -2;
          sqlite3VdbeAddOp4(in_stack_ffffffffffffff90,p2,in_stack_ffffffffffffff88,
                            (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                            (int)in_stack_ffffffffffffff80,
                            (char *)CONCAT44(in_stack_ffffffffffffff7c,0xfffffffe),
                            in_stack_ffffffffffffffa0);
        }
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          (int)in_stack_ffffffffffffff90,p2,in_stack_ffffffffffffff88);
        sqlite3VdbeAppendP4(in_stack_ffffffffffffff90,(void *)CONCAT44(p2,in_stack_ffffffffffffff88)
                            ,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        sqlite3VdbeChangeP5((Vdbe *)p_00,p5);
        if (local_38->bExprArgs != '\0') {
          sqlite3ReleaseTempRange
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
        }
      }
    }
    else {
      sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,0);
    }
    if (srcReg != 0) {
      sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
  }
  return;
}

Assistant:

static void windowAggStep(
  WindowCodeArg *p,
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pWFunc;
    int regArg;
    int nArg = pWin->bExprArgs ? 0 : windowArgCount(pWin);
    int i;
    int addrIf = 0;

    assert( bInverse==0 || pWin->eStart!=TK_UNBOUNDED );

    /* All OVER clauses in the same window function aggregate step must
    ** be the same. */
    assert( pWin==pMWin || sqlite3WindowCompare(pParse,pWin,pMWin,0)!=1 );

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pWin->pFilter ){
      int regTmp;
      assert( ExprUseXList(pWin->pOwner) );
      assert( pWin->bExprArgs || !nArg ||nArg==pWin->pOwner->x.pList->nExpr );
      assert( pWin->bExprArgs || nArg  ||pWin->pOwner->x.pList==0 );
      regTmp = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
      addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regTmp);
    }

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pWin->pFilter==0 );
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      if( pWin->bExprArgs ){
        int iOp = sqlite3VdbeCurrentAddr(v);
        int iEnd;

        assert( ExprUseXList(pWin->pOwner) );
        nArg = pWin->pOwner->x.pList->nExpr;
        regArg = sqlite3GetTempRange(pParse, nArg);
        sqlite3ExprCodeExprList(pParse, pWin->pOwner->x.pList, regArg, 0, 0);

        for(iEnd=sqlite3VdbeCurrentAddr(v); iOp<iEnd; iOp++){
          VdbeOp *pOp = sqlite3VdbeGetOp(v, iOp);
          if( pOp->opcode==OP_Column && pOp->p1==pMWin->iEphCsr ){
            pOp->p1 = csr;
          }
        }
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        assert( ExprUseXList(pWin->pOwner) );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep,
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      if( pWin->bExprArgs ){
        sqlite3ReleaseTempRange(pParse, regArg, nArg);
      }
    }

    if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
  }
}